

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PSymbol * __thiscall PSymbolTable::AddSymbol(PSymbolTable *this,PSymbol *sym)

{
  PSymbol **ppPVar1;
  FName local_28;
  FName local_24;
  PSymbolTable *local_20;
  PSymbol *sym_local;
  PSymbolTable *this_local;
  
  local_20 = (PSymbolTable *)sym;
  sym_local = (PSymbol *)this;
  FName::FName(&local_24,(FName *)&(sym->super_PTypeBase).super_DObject.field_0x24);
  ppPVar1 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                      (&this->Symbols,&local_24);
  if (ppPVar1 == (PSymbol **)0x0) {
    FName::FName(&local_28,(FName *)((long)&local_20[1].ParentSymbolTable + 4));
    TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::Insert
              (&this->Symbols,&local_28,(PSymbol **)&local_20);
    this_local = local_20;
  }
  else {
    this_local = (PSymbolTable *)0x0;
  }
  return (PSymbol *)this_local;
}

Assistant:

PSymbol *PSymbolTable::AddSymbol (PSymbol *sym)
{
	// Symbols that already exist are not inserted.
	if (Symbols.CheckKey(sym->SymbolName) != NULL)
	{
		return NULL;
	}
	Symbols.Insert(sym->SymbolName, sym);
	return sym;
}